

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall
amrex::TagBoxArray::collate(TagBoxArray *this,PinnedVector<IntVect> *TheGlobalCollateSpace)

{
  int iVar1;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RSI;
  Long numtags;
  Long count;
  PinnedVector<IntVect> TheLocalCollateSpace;
  PinnedVector<IntVect> *in_stack_000002d8;
  TagBoxArray *in_stack_000002e0;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffff88;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_ffffffffffffff90;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *msg;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_50;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_48;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_30;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_18;
  char *local_8;
  
  msg = &local_30;
  local_18 = in_RSI;
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::PODVector(in_stack_ffffffffffffff90);
  local_collate_cpu(in_stack_000002e0,in_stack_000002d8);
  local_50 = (PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
             PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::size(&local_30);
  local_48 = local_50;
  ParallelDescriptor::ReduceLongSum((Long *)&local_50);
  if (local_50 == (PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x0) {
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::clear(local_18);
  }
  else {
    in_stack_ffffffffffffff90 = local_50;
    iVar1 = std::numeric_limits<int>::max();
    if ((long)iVar1 < (long)in_stack_ffffffffffffff90) {
      local_8 = 
      "TagBoxArray::collate: Too many tags. Using a larger blocking factor might help. Please file an issue on github"
      ;
      Abort_host((char *)msg);
    }
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~PODVector(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
TagBoxArray::collate (Gpu::PinnedVector<IntVect>& TheGlobalCollateSpace) const
{
    BL_PROFILE("TagBoxArray::collate()");

    Gpu::PinnedVector<IntVect> TheLocalCollateSpace;
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        local_collate_gpu(TheLocalCollateSpace);
    } else
#endif
    {
        local_collate_cpu(TheLocalCollateSpace);
    }

    Long count = TheLocalCollateSpace.size();

    //
    // The total number of tags system wide that must be collated.
    //
    Long numtags = count;
    ParallelDescriptor::ReduceLongSum(numtags);

    if (numtags == 0) {
        TheGlobalCollateSpace.clear();
        return;
    } else if (numtags > static_cast<Long>(std::numeric_limits<int>::max())) {
        // xxxxx todo
        amrex::Abort("TagBoxArray::collate: Too many tags. Using a larger blocking factor might help. Please file an issue on github");
    }

#ifdef BL_USE_MPI
    //
    // On I/O proc. this holds all tags after they've been gather'd.
    // On other procs. non-mempty signals size is not zero.
    //
    if (ParallelDescriptor::IOProcessor()) {
        TheGlobalCollateSpace.resize(numtags);
    } else {
        TheGlobalCollateSpace.resize(1);
    }

    //
    // Tell root CPU how many tags each CPU will be sending.
    //
    const int IOProcNumber = ParallelDescriptor::IOProcessorNumber();
    const std::vector<int>& countvec = ParallelDescriptor::Gather(static_cast<int>(count),
                                                                  IOProcNumber);
    std::vector<int> offset(countvec.size(),0);
    if (ParallelDescriptor::IOProcessor()) {
        for (int i = 1, N = offset.size(); i < N; i++) {
            offset[i] = offset[i-1] + countvec[i-1];
        }
    }
    //
    // Gather all the tags to IOProcNumber into TheGlobalCollateSpace.
    //
    const IntVect* psend = (count > 0) ? TheLocalCollateSpace.data() : nullptr;
    IntVect* precv = TheGlobalCollateSpace.data();

    // Issues have been observed with the following call at very large scale when using
    // FujitsuMPI. The issue seems to be related to the use of MPI_Datatype. We can
    // bypasses the issue by exchanging simpler integer arrays.
#if !(defined(__FUJITSU) || defined(__CLANG_FUJITSU))
    ParallelDescriptor::Gatherv(psend, count, precv, countvec, offset, IOProcNumber);
#else
    const int* psend_int = psend->begin();
    int* precv_int = precv->begin();
    Long count_int = count * AMREX_SPACEDIM;
    auto countvec_int = std::vector<int>(countvec.size());
    auto offset_int = std::vector<int>(offset.size());
    const auto mul_funct = [](const auto el){return el*AMREX_SPACEDIM;};
    std::transform(countvec.begin(), countvec.end(), countvec_int.begin(), mul_funct);
    std::transform(offset.begin(), offset.end(), offset_int.begin(), mul_funct);
    ParallelDescriptor::Gatherv(
        psend_int, count_int, precv_int, countvec_int, offset_int, IOProcNumber);
#endif

#else
    TheGlobalCollateSpace = std::move(TheLocalCollateSpace);
#endif
}